

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.h
# Opt level: O0

string * __thiscall dynet::Dict::convert_abi_cxx11_(Dict *this,int *id)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  const_reference pvVar4;
  int *in_RSI;
  long in_RDI;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [376];
  int *local_10;
  
  iVar1 = *in_RSI;
  local_10 = in_RSI;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 8));
  if ((int)sVar2 <= iVar1) {
    std::__cxx11::ostringstream::ostringstream(local_188);
    poVar3 = std::operator<<((ostream *)local_188,
                             "Out-of-bounds error in Dict::convert for word ID ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*local_10);
    poVar3 = std::operator<<(poVar3," (dict size: ");
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RDI + 8));
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar2);
    std::operator<<(poVar3,")");
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1b8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)(in_RDI + 8),(long)*local_10);
  return pvVar4;
}

Assistant:

inline const std::string& convert(const int& id) const {
    DYNET_ARG_CHECK(id < (int)words_.size(), 
                            "Out-of-bounds error in Dict::convert for word ID " << id <<
                            " (dict size: " << words_.size() << ")");
    return words_[id];
  }